

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::initEmpty(DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
            *this)

{
  uint uVar1;
  uint uVar2;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar3;
  Abbrev *this_00;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *E;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *local_38;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *B;
  Abbrev EmptyKey;
  DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  EmptyKey.Attributes.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  setNumEntries(this,0);
  setNumTombstones(this,0);
  uVar1 = getNumBuckets(this);
  uVar2 = getNumBuckets(this);
  if ((uVar1 & uVar2 - 1) != 0) {
    __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x15c,
                  "void llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::initEmpty() [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>]"
                 );
  }
  getEmptyKey();
  local_38 = getBuckets(this);
  pDVar3 = getBucketsEnd(this);
  for (; local_38 != pDVar3; local_38 = local_38 + 1) {
    this_00 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(local_38);
    DWARFDebugNames::Abbrev::Abbrev(this_00,(Abbrev *)&B);
  }
  DWARFDebugNames::Abbrev::~Abbrev((Abbrev *)&B);
  return;
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }